

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool tidyOptCopyConfig(TidyDoc to,TidyDoc from)

{
  TidyDocImpl *docFrom;
  TidyDocImpl *docTo;
  TidyDoc from_local;
  TidyDoc to_local;
  
  if ((to == (TidyDoc)0x0) || (from == (TidyDoc)0x0)) {
    to_local._4_4_ = no;
  }
  else {
    prvTidyCopyConfig((TidyDocImpl *)to,(TidyDocImpl *)from);
    to_local._4_4_ = yes;
  }
  return to_local._4_4_;
}

Assistant:

Bool TIDY_CALL tidyOptCopyConfig( TidyDoc to, TidyDoc from )
{
    TidyDocImpl* docTo = tidyDocToImpl( to );
    TidyDocImpl* docFrom = tidyDocToImpl( from );
    if ( docTo && docFrom )
    {
        TY_(CopyConfig)( docTo, docFrom );
        return yes;
    }
    return no;
}